

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreen::Destroy(DIntermissionScreen *this)

{
  int iVar1;
  undefined4 extraout_var;
  int local_1c;
  int i;
  PalEntry *palette;
  DIntermissionScreen *this_local;
  
  if ((this->mPaletteChanged & 1U) != 0) {
    iVar1 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
      *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(CONCAT44(extraout_var,iVar1) + (long)local_1c * 4)
           = GPalette.BaseColors[local_1c].field_0;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    NoWipe = 5;
    this->mPaletteChanged = false;
    M_EnableMenu(true);
  }
  S_StopSound(2);
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DIntermissionScreen::Destroy()
{
	if (mPaletteChanged)
	{
		PalEntry *palette;
		int i;

		palette = screen->GetPalette ();
		for (i = 0; i < 256; ++i)
		{
			palette[i] = GPalette.BaseColors[i];
		}
		screen->UpdatePalette ();
		NoWipe = 5;
		mPaletteChanged = false;
		M_EnableMenu(true);
	}
	S_StopSound(CHAN_VOICE);
	Super::Destroy();
}